

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

void anon_unknown.dwarf_1d67ba::contextDestroyCallback(void *param_1)

{
  bool bVar1;
  iterator __position;
  pointer ppVar2;
  GLuint frameBuffer;
  iterator iter;
  iterator frameBuffersIter;
  Uint64 contextId;
  Lock lock;
  set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  *in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  Mutex *in_stack_ffffffffffffff98;
  Lock *in_stack_ffffffffffffffa0;
  uint local_4c;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  _Self local_30 [3];
  _Base_ptr local_18;
  
  sf::Lock::Lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __position._M_node = (_Base_ptr)sf::Context::getActiveContextId();
  local_18 = __position._M_node;
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
       ::begin(in_stack_ffffffffffffff88);
  do {
    local_38._M_node =
         (_Base_ptr)
         std::
         set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_30,&local_38);
    if (!bVar1) {
      destroyStaleFBOs();
      sf::Lock::~Lock((Lock *)in_stack_ffffffffffffff90._M_node);
      return;
    }
    std::
    _Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>
    ::operator*((_Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>
                 *)in_stack_ffffffffffffff90._M_node);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::begin((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
                  *)in_stack_ffffffffffffff88);
    while( true ) {
      std::
      _Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>
      ::operator*((_Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>
                   *)in_stack_ffffffffffffff90._M_node);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
           ::end((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
                  *)in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::
               operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
                          0x2229aa);
      if ((_Base_ptr)ppVar2->first == local_18) {
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *
                            )0x2229be);
        local_4c = ppVar2->second;
        (*sf_glad_glDeleteFramebuffersEXT)(1,&local_4c);
        std::
        _Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>
        ::operator*((_Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>
                     *)in_stack_ffffffffffffff90._M_node);
        in_stack_ffffffffffffff90 =
             std::
             map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
             ::erase_abi_cxx11_(in_stack_ffffffffffffff90._M_node,__position);
        break;
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
                 in_stack_ffffffffffffff90._M_node);
    }
    std::
    _Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>
    ::operator++((_Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>
                  *)in_stack_ffffffffffffff90._M_node);
  } while( true );
}

Assistant:

void contextDestroyCallback(void* /*arg*/)
    {
        sf::Lock lock(mutex);

        sf::Uint64 contextId = sf::Context::getActiveContextId();

        // Destroy active frame buffer objects
        for (std::set<std::map<sf::Uint64, unsigned int>*>::iterator frameBuffersIter = frameBuffers.begin(); frameBuffersIter != frameBuffers.end(); ++frameBuffersIter)
        {
            for (std::map<sf::Uint64, unsigned int>::iterator iter = (*frameBuffersIter)->begin(); iter != (*frameBuffersIter)->end(); ++iter)
            {
                if (iter->first == contextId)
                {
                    GLuint frameBuffer = iter->second;
                    glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

                    // Erase the entry from the RenderTextureImplFBO's map
                    (*frameBuffersIter)->erase(iter);

                    break;
                }
            }
        }

        // Destroy stale frame buffer objects
        destroyStaleFBOs();
    }